

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::SetYellow
          (InstructionDisassembler *this,ostream *stream)

{
  char *pcVar1;
  yellow local_9;
  
  if (this->color_ == true) {
    local_9.isPrint = this->print_;
    pcVar1 = clr::yellow::operator_cast_to_char_(&local_9);
    std::operator<<(stream,pcVar1);
  }
  return;
}

Assistant:

void InstructionDisassembler::SetYellow(std::ostream& stream) const {
  if (color_) stream << spvtools::clr::yellow{print_};
}